

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.h
# Opt level: O3

void __thiscall ON_2dVectorArray::~ON_2dVectorArray(ON_2dVectorArray *this)

{
  ON_SimpleArray<ON_2dVector>::~ON_SimpleArray(&this->super_ON_SimpleArray<ON_2dVector>);
  operator_delete(this,0x18);
  return;
}

Assistant:

class ON_CLASS ON_2dVectorArray : public ON_SimpleArray<ON_2dVector>
{
public:
  // see ON_SimpleArray class definition comments for constructor documentation
  ON_2dVectorArray();
  ON_2dVectorArray(int);
  ON_2dVectorArray(const ON_2dVectorArray&);
  ON_2dVectorArray& operator=( const ON_2dVectorArray& );

  bool GetBBox(
         double boxmin[2],
         double boxmax[2],
         bool bGrowBox = false
         ) const;

  bool Transform( const ON_Xform& );
  bool SwapCoordinates(int,int);
}